

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O0

void __thiscall chrono::robosimian::RS_Chassis::Initialize(RS_Chassis *this,ChCoordsys<double> *pos)

{
  element_type *peVar1;
  element_type *peVar2;
  shared_ptr<chrono::collision::ChCollisionModel> local_110;
  shared_ptr<chrono::collision::ChCollisionModel> local_100;
  shared_ptr<chrono::collision::ChCollisionModel> local_f0;
  shared_ptr<chrono::collision::ChCollisionModel> local_e0;
  shared_ptr<chrono::collision::ChCollisionModel> local_d0;
  shared_ptr<chrono::collision::ChCollisionModel> local_c0 [2];
  ChFrame<double> local_a0;
  ChCoordsys<double> *local_18;
  ChCoordsys<double> *pos_local;
  RS_Chassis *this_local;
  
  local_18 = pos;
  pos_local = (ChCoordsys<double> *)this;
  peVar1 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_RS_Part).m_body);
  ChFrame<double>::ChFrame(&local_a0,local_18);
  chrono::ChBodyAuxRef::SetFrame_REF_to_abs((ChFrame *)peVar1);
  ChFrame<double>::~ChFrame(&local_a0);
  RS_Part::AddCollisionShapes(&this->super_RS_Part);
  std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &(this->super_RS_Part).m_body);
  ChBody::GetCollisionModel((ChBody *)local_c0);
  peVar2 = std::
           __shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_c0);
  (**(code **)(*(long *)peVar2 + 200))(peVar2,5);
  std::shared_ptr<chrono::collision::ChCollisionModel>::~shared_ptr(local_c0);
  std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &(this->super_RS_Part).m_body);
  ChBody::GetCollisionModel((ChBody *)&local_d0);
  peVar2 = std::
           __shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_d0);
  (**(code **)(*(long *)peVar2 + 0xd8))(peVar2,1);
  std::shared_ptr<chrono::collision::ChCollisionModel>::~shared_ptr(&local_d0);
  std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &(this->super_RS_Part).m_body);
  ChBody::GetCollisionModel((ChBody *)&local_e0);
  peVar2 = std::
           __shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_e0);
  (**(code **)(*(long *)peVar2 + 0xd8))(peVar2,2);
  std::shared_ptr<chrono::collision::ChCollisionModel>::~shared_ptr(&local_e0);
  std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &(this->super_RS_Part).m_body);
  ChBody::GetCollisionModel((ChBody *)&local_f0);
  peVar2 = std::
           __shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_f0);
  (**(code **)(*(long *)peVar2 + 0xd8))(peVar2,3);
  std::shared_ptr<chrono::collision::ChCollisionModel>::~shared_ptr(&local_f0);
  std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &(this->super_RS_Part).m_body);
  ChBody::GetCollisionModel((ChBody *)&local_100);
  peVar2 = std::
           __shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_100);
  (**(code **)(*(long *)peVar2 + 0xd8))(peVar2,4);
  std::shared_ptr<chrono::collision::ChCollisionModel>::~shared_ptr(&local_100);
  std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &(this->super_RS_Part).m_body);
  ChBody::GetCollisionModel((ChBody *)&local_110);
  peVar2 = std::
           __shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_110);
  (**(code **)(*(long *)peVar2 + 0xd8))(peVar2,6);
  std::shared_ptr<chrono::collision::ChCollisionModel>::~shared_ptr(&local_110);
  peVar1 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_RS_Part).m_body);
  chrono::ChBody::SetCollide(SUB81(peVar1,0));
  return;
}

Assistant:

void RS_Chassis::Initialize(const ChCoordsys<>& pos) {
    m_body->SetFrame_REF_to_abs(ChFrame<>(pos));

    AddCollisionShapes();

    m_body->GetCollisionModel()->SetFamily(CollisionFamily::CHASSIS);
    m_body->GetCollisionModel()->SetFamilyMaskNoCollisionWithFamily(CollisionFamily::LIMB_FR);
    m_body->GetCollisionModel()->SetFamilyMaskNoCollisionWithFamily(CollisionFamily::LIMB_RR);
    m_body->GetCollisionModel()->SetFamilyMaskNoCollisionWithFamily(CollisionFamily::LIMB_RL);
    m_body->GetCollisionModel()->SetFamilyMaskNoCollisionWithFamily(CollisionFamily::LIMB_FL);
    m_body->GetCollisionModel()->SetFamilyMaskNoCollisionWithFamily(CollisionFamily::SLED);

    // Note: call this AFTER setting the collision family (required for Chrono::Multicore)
    m_body->SetCollide(m_collide);
}